

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O1

bool __thiscall TimerNode::isValid(TimerNode *this)

{
  ulong uVar1;
  timeval now;
  timeval local_20;
  
  gettimeofday(&local_20,(__timezone_ptr_t)0x0);
  uVar1 = local_20.tv_usec / 1000 + (local_20.tv_sec % 10000) * 1000;
  if (this->expiredTime_ <= uVar1) {
    this->deleted_ = true;
  }
  return uVar1 < this->expiredTime_;
}

Assistant:

bool TimerNode::isValid(){
    struct timeval now;
    gettimeofday(&now, nullptr);
    size_t temp=(((now.tv_sec%10000)*1000)+(now.tv_usec/1000));
    if (temp<expiredTime_) {
        return true;
    }else {
        this->setDeleted();
        return false;
    }
}